

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O0

void cos1D_testSaveLoadAndParamHandling<IMLE<1,1,FastLinearExpert>>
               (IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  ostream *poVar1;
  IMLE<1,_1,_FastLinearExpert> *in_RDI;
  Param param;
  string *in_stack_00000240;
  IMLE<1,_1,_FastLinearExpert> *in_stack_00000248;
  int in_stack_0000094c;
  IMLE<1,_1,_FastLinearExpert> *in_stack_00000950;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffe88;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffe90;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [200];
  IMLE<1,_1,_FastLinearExpert> *local_8;
  
  local_8 = in_RDI;
  IMLE<1,_1,_FastLinearExpert>::getParameters(in_RDI);
  IMLE<1,_1,_FastLinearExpert>::Param::Param
            (&in_stack_fffffffffffffe90->param,&in_stack_fffffffffffffe88->param);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-- Initial parameters: --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  IMLE<1,_1,_FastLinearExpert>::displayParameters
            (in_stack_fffffffffffffe90,(ostream *)in_stack_fffffffffffffe88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"cos1D.xml",&local_d1);
  IMLE<1,_1,_FastLinearExpert>::loadParameters(in_stack_00000248,in_stack_00000240);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\t-- Now the IMLE object has default parameters: --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  IMLE<1,_1,_FastLinearExpert>::displayParameters
            (in_stack_fffffffffffffe90,(ostream *)in_stack_fffffffffffffe88);
  IMLE<1,_1,_FastLinearExpert>::setParameters
            (in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->param);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-- Reverting to initial parameters: --");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  IMLE<1,_1,_FastLinearExpert>::displayParameters
            (in_stack_fffffffffffffe90,(ostream *)in_stack_fffffffffffffe88);
  cos1D_train<IMLE<1,1,FastLinearExpert>>(in_stack_00000950,in_stack_0000094c);
  cos1D_display<IMLE<1,1,FastLinearExpert>>(in_stack_fffffffffffffe90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"cos1D_demo.imle",&local_f9);
  IMLE<1,_1,_FastLinearExpert>::save
            ((IMLE<1,_1,_FastLinearExpert> *)param._144_8_,(string *)param._136_8_);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  IMLE<1,_1,_FastLinearExpert>::reset(in_stack_fffffffffffffe90);
  operator<<((ostream *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  cos1D_train<IMLE<1,1,FastLinearExpert>>(in_stack_00000950,in_stack_0000094c);
  cos1D_display<IMLE<1,1,FastLinearExpert>>(in_stack_fffffffffffffe90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"cos1D_demo.imle",&local_121);
  IMLE<1,_1,_FastLinearExpert>::load
            ((IMLE<1,_1,_FastLinearExpert> *)param._144_8_,(string *)param._136_8_);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  operator<<((ostream *)local_8,in_stack_fffffffffffffe88);
  IMLE<1,_1,_FastLinearExpert>::Param::~Param((Param *)0x237813);
  return;
}

Assistant:

void cos1D_testSaveLoadAndParamHandling( Learner &imleObj )
{
	// Parameter handling
	typename Learner::Param param = imleObj.getParameters();
	cout << "\t-- Initial parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.loadParameters("cos1D.xml");
	cout << "\t-- Now the IMLE object has default parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.setParameters(param);
	cout << "\t-- Reverting to initial parameters: --" << endl;
	imleObj.displayParameters();

	// Training (10 points)
    cos1D_train(imleObj, 10);

    // Display info
    cos1D_display(imleObj);

    // Save
    imleObj.save("cos1D_demo.imle");

    // Reset
    imleObj.reset();
    cout << imleObj;

    // Train again
    cos1D_train(imleObj, 20);
    cos1D_display(imleObj);

    // Load
    imleObj.load("cos1D_demo.imle");
    cout << imleObj;
}